

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Own<kj::ConnectionReceiver,_std::nullptr_t> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapListenSocketFd
          (LowLevelAsyncIoProviderImpl *this,int fd,NetworkFilter *filter,uint flags)

{
  UnixEventPort *eventPort;
  UnixEventPort *pUVar1;
  undefined4 in_register_0000000c;
  ConnectionReceiver *extraout_RDX;
  undefined4 in_register_00000034;
  uint in_R8D;
  Own<kj::ConnectionReceiver,_std::nullptr_t> OVar2;
  
  eventPort = (UnixEventPort *)
              ((MonotonicClock *)CONCAT44(in_register_00000034,fd))[1]._vptr_MonotonicClock;
  pUVar1 = (UnixEventPort *)operator_new(0x80);
  (pUVar1->super_EventPort)._vptr_EventPort = (_func_int **)&PTR___cxa_pure_virtual_00709ba0;
  OwnedFileDescriptor::OwnedFileDescriptor
            ((OwnedFileDescriptor *)&pUVar1->super_SleepHooks,(int)filter,in_R8D);
  (pUVar1->super_EventPort)._vptr_EventPort = (_func_int **)&PTR_accept_0070e150;
  pUVar1->clock = (MonotonicClock *)CONCAT44(in_register_00000034,fd);
  (pUVar1->timerImpl).super_Timer.super_MonotonicClock._vptr_MonotonicClock =
       (_func_int **)eventPort;
  (pUVar1->timerImpl).time.value.value = CONCAT44(in_register_0000000c,flags);
  UnixEventPort::FdObserver::FdObserver
            ((FdObserver *)&(pUVar1->timerImpl).impl,eventPort,(int)filter,1);
  (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::FdConnectionReceiver>::instance
  ;
  this->eventPort = pUVar1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<ConnectionReceiver> wrapListenSocketFd(
      int fd, NetworkFilter& filter, uint flags = 0) override {
    return heap<FdConnectionReceiver>(*this, eventPort, fd, filter, flags);
  }